

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmap.h
# Opt level: O2

void __thiscall MeCab::Mmap<char>::Mmap(Mmap<char> *this)

{
  this->_vptr_Mmap = (_func_int **)&PTR__Mmap_0016bc68;
  this->text = (char *)0x0;
  (this->fileName)._M_dataplus._M_p = (pointer)&(this->fileName).field_2;
  (this->fileName)._M_string_length = 0;
  (this->fileName).field_2._M_local_buf[0] = '\0';
  whatlog::whatlog(&this->what_);
  this->fd = -1;
  return;
}

Assistant:

Mmap(): text(0), fd(-1) {}